

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O2

TypedName * __thiscall
VkSpecParser::parseParamOrProto(TypedName *__return_storage_ptr__,VkSpecParser *this,QString *tag)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  char cVar4;
  bool bVar5;
  storage_type_conflict *psVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QStringView QVar8;
  QArrayDataPointer<char16_t> local_90;
  undefined1 local_78 [16];
  qsizetype local_68;
  QStringView local_58;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->typeSuffix).d.d = (Data *)0x0;
  (__return_storage_ptr__->typeSuffix).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->type).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->type).d.size = 0;
  (__return_storage_ptr__->name).d.size = 0;
  (__return_storage_ptr__->type).d.d = (Data *)0x0;
  (__return_storage_ptr__->typeSuffix).d.size = 0;
  (__return_storage_ptr__->name).d.d = (Data *)0x0;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
  do {
LAB_00103e6a:
    do {
      cVar4 = QXmlStreamReader::atEnd();
      if (cVar4 != '\0') {
LAB_00104075:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return __return_storage_ptr__;
        }
        __stack_chk_fail();
      }
      QXmlStreamReader::readNext();
      bVar5 = QXmlStreamReader::isEndElement(&this->m_reader);
      if (bVar5) {
        auVar7 = QXmlStreamReader::name();
        local_90.ptr = (tag->d).ptr;
        local_90.d = (Data *)(tag->d).size;
        local_78 = auVar7;
        bVar5 = comparesEqual((QStringView *)local_78,(QStringView *)&local_90);
        if (bVar5) goto LAB_00104075;
      }
      bVar5 = QXmlStreamReader::isStartElement(&this->m_reader);
      if (bVar5) {
        QVar8 = (QStringView)QXmlStreamReader::name();
        local_78._0_8_ = (Data *)0x0;
        local_90.d = (Data *)0x0;
        local_90.ptr = (char16_t *)0x0;
        local_90.size = 0;
        local_78._8_8_ = L"name";
        local_68 = 4;
        local_58.m_size = 4;
        local_58.m_data = L"name";
        local_48 = QVar8;
        bVar5 = comparesEqual(&local_48,&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
        if (bVar5) {
          parseName((QString *)local_78,this);
          pDVar2 = (__return_storage_ptr__->name).d.d;
          pcVar3 = (__return_storage_ptr__->name).d.ptr;
          (__return_storage_ptr__->name).d.d = (Data *)local_78._0_8_;
          (__return_storage_ptr__->name).d.ptr = (char16_t *)local_78._8_8_;
          qVar1 = (__return_storage_ptr__->name).d.size;
          (__return_storage_ptr__->name).d.size = local_68;
          local_78._0_8_ = pDVar2;
          local_78._8_8_ = pcVar3;
          local_68 = qVar1;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
        }
        else {
          QVar8 = (QStringView)QXmlStreamReader::name();
          local_78._0_8_ = (Data *)0x0;
          local_90.d = (Data *)0x0;
          local_90.ptr = (char16_t *)0x0;
          local_90.size = 0;
          local_78._8_8_ = L"type";
          local_68 = 4;
          local_58.m_size = 4;
          local_58.m_data = L"type";
          local_48 = QVar8;
          bVar5 = operator!=(&local_48,&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
          if (bVar5) {
            skip(this);
          }
        }
        goto LAB_00103e6a;
      }
      auVar7 = QXmlStreamReader::text();
      local_78 = auVar7;
      QVar8 = QStringView::trimmed((QStringView *)local_78);
      psVar6 = QVar8.m_data;
    } while (QVar8.m_size == 0);
    if (*psVar6 == L'[') {
      QString::append((QChar *)&__return_storage_ptr__->typeSuffix,(longlong)psVar6);
      goto LAB_00103e6a;
    }
    if ((__return_storage_ptr__->type).d.size != 0) {
      QString::append((QChar)(char16_t)&__return_storage_ptr__->type);
    }
    QString::append((QChar *)&__return_storage_ptr__->type,(longlong)psVar6);
  } while( true );
}

Assistant:

VkSpecParser::TypedName VkSpecParser::parseParamOrProto(const QString &tag)
{
    TypedName t;

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == tag)
            break;
        if (m_reader.isStartElement()) {
            if (m_reader.name() == QStringLiteral("name")) {
                t.name = parseName();
            } else if (m_reader.name() != QStringLiteral("type")) {
                skip();
            }
        } else {
            auto text = m_reader.text().trimmed();
            if (!text.isEmpty()) {
                if (text.startsWith(u'[')) {
                    t.typeSuffix += text;
                } else {
                    if (!t.type.isEmpty())
                        t.type += u' ';
                    t.type += text;
                }
            }
        }
    }

    return t;
}